

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tiny_gltf.h
# Opt level: O0

void __thiscall tinygltf::Sampler::Sampler(Sampler *this,Sampler *param_1)

{
  int iVar1;
  Sampler *param_1_local;
  Sampler *this_local;
  
  std::__cxx11::string::string((string *)this,(string *)param_1);
  iVar1 = param_1->magFilter;
  this->minFilter = param_1->minFilter;
  this->magFilter = iVar1;
  iVar1 = param_1->wrapT;
  this->wrapS = param_1->wrapS;
  this->wrapT = iVar1;
  Value::Value(&this->extras,&param_1->extras);
  std::
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinygltf::Value,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinygltf::Value>_>_>
  ::map(&this->extensions,&param_1->extensions);
  std::__cxx11::string::string
            ((string *)&this->extras_json_string,(string *)&param_1->extras_json_string);
  std::__cxx11::string::string
            ((string *)&this->extensions_json_string,(string *)&param_1->extensions_json_string);
  return;
}

Assistant:

Sampler() = default;